

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.h
# Opt level: O0

bool __thiscall llvm::APInt::operator==(APInt *this,uint64_t Val)

{
  bool bVar1;
  uint uVar2;
  uint64_t uVar3;
  uint64_t Val_local;
  APInt *this_local;
  
  bVar1 = isSingleWord(this);
  if ((!bVar1) && (uVar2 = getActiveBits(this), 0x40 < uVar2)) {
    return false;
  }
  uVar3 = getZExtValue(this);
  return uVar3 == Val;
}

Assistant:

bool operator==(uint64_t Val) const {
    return (isSingleWord() || getActiveBits() <= 64) && getZExtValue() == Val;
  }